

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O3

void __thiscall sznet::net::Poller::Poller(Poller *this,EventLoop *loop)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->m_channels)._M_t._M_impl.super__Rb_tree_header;
  this->_vptr_Poller = (_func_int **)&PTR__Poller_00135cd0;
  (this->m_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_channels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_ownerLoop = loop;
  return;
}

Assistant:

Poller::Poller(EventLoop* loop): 
	m_ownerLoop(loop)
{
}